

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int collectargs(char **argv,int *first)

{
  char cVar1;
  int local_28;
  uint local_24;
  int i;
  int args;
  int *first_local;
  char **argv_local;
  
  local_24 = 0;
  local_28 = 1;
  do {
    if (argv[local_28] == (char *)0x0) {
      *first = local_28;
      return local_24;
    }
    *first = local_28;
    if (*argv[local_28] != '-') {
      return local_24;
    }
    cVar1 = argv[local_28][1];
    if (cVar1 == '\0') {
      return local_24;
    }
    if (cVar1 == '-') {
      if (argv[local_28][2] != '\0') {
        return 1;
      }
      *first = local_28 + 1;
      return local_24;
    }
    if (cVar1 == 'E') {
      if (argv[local_28][2] != '\0') {
        return 1;
      }
      local_24 = local_24 | 0x10;
    }
    else if (cVar1 == 'e') {
      local_24 = local_24 | 8;
LAB_00102a05:
      if ((argv[local_28][2] == '\0') &&
         ((local_28 = local_28 + 1, argv[local_28] == (char *)0x0 || (*argv[local_28] == '-')))) {
        return 1;
      }
    }
    else {
      if (cVar1 == 'i') {
        local_24 = local_24 | 2;
      }
      else {
        if (cVar1 == 'l') goto LAB_00102a05;
        if (cVar1 != 'v') {
          return 1;
        }
      }
      if (argv[local_28][2] != '\0') {
        return 1;
      }
      local_24 = local_24 | 4;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int collectargs (char **argv, int *first) {
  int args = 0;
  int i;
  for (i = 1; argv[i] != NULL; i++) {
    *first = i;
    if (argv[i][0] != '-')  /* not an option? */
        return args;  /* stop handling options */
    switch (argv[i][1]) {  /* else check option */
      case '-':  /* '--' */
        if (argv[i][2] != '\0')  /* extra characters after '--'? */
          return has_error;  /* invalid option */
        *first = i + 1;
        return args;
      case '\0':  /* '-' */
        return args;  /* script "name" is '-' */
      case 'E':
        if (argv[i][2] != '\0')  /* extra characters after 1st? */
          return has_error;  /* invalid option */
        args |= has_E;
        break;
      case 'i':
        args |= has_i;  /* (-i implies -v) *//* FALLTHROUGH */
      case 'v':
        if (argv[i][2] != '\0')  /* extra characters after 1st? */
          return has_error;  /* invalid option */
        args |= has_v;
        break;
      case 'e':
        args |= has_e;  /* FALLTHROUGH */
      case 'l':  /* both options need an argument */
        if (argv[i][2] == '\0') {  /* no concatenated argument? */
          i++;  /* try next 'argv' */
          if (argv[i] == NULL || argv[i][0] == '-')
            return has_error;  /* no next argument or it is another option */
        }
        break;
      default:  /* invalid option */
        return has_error;
    }
  }
  *first = i;  /* no script name */
  return args;
}